

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md4c-html.c
# Opt level: O0

int enter_block_callback(MD_BLOCKTYPE type,void *detail,void *userdata)

{
  MD_CHAR *cell_type;
  MD_HTML *in_RDX;
  int *in_RSI;
  uint in_EDI;
  char *__s;
  MD_BLOCK_OL_DETAIL *in_stack_00000008;
  MD_HTML *in_stack_00000010;
  MD_HTML *r;
  MD_BLOCK_CODE_DETAIL *in_stack_ffffffffffffffb8;
  MD_HTML *in_stack_ffffffffffffffc0;
  MD_HTML *r_00;
  MD_BLOCK_TD_DETAIL *in_stack_ffffffffffffffd0;
  
  cell_type = (MD_CHAR *)(ulong)in_EDI;
  switch(cell_type) {
  case (MD_CHAR *)0x0:
    break;
  case (MD_CHAR *)0x1:
    render_verbatim(in_stack_ffffffffffffffc0,(MD_CHAR *)in_stack_ffffffffffffffb8,0);
    break;
  case (MD_CHAR *)0x2:
    render_verbatim(in_stack_ffffffffffffffc0,(MD_CHAR *)in_stack_ffffffffffffffb8,0);
    break;
  case (MD_CHAR *)0x3:
    render_open_ol_block(in_stack_00000010,in_stack_00000008);
    break;
  case (MD_CHAR *)0x4:
    render_open_li_block(in_stack_ffffffffffffffc0,(MD_BLOCK_LI_DETAIL *)in_stack_ffffffffffffffb8);
    break;
  case (MD_CHAR *)0x5:
    __s = "<hr>\n";
    if ((in_RDX->flags & 8) != 0) {
      __s = "<hr />\n";
    }
    strlen(__s);
    render_verbatim(in_stack_ffffffffffffffc0,(MD_CHAR *)in_stack_ffffffffffffffb8,0);
    break;
  case (MD_CHAR *)0x6:
    r_00 = (MD_HTML *)enter_block_callback::head[*in_RSI - 1];
    strlen(enter_block_callback::head[*in_RSI - 1]);
    render_verbatim(r_00,(MD_CHAR *)in_RDX,0);
    break;
  case (MD_CHAR *)0x7:
    render_open_code_block(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    break;
  case (MD_CHAR *)0x8:
    break;
  case (MD_CHAR *)0x9:
    render_verbatim(in_stack_ffffffffffffffc0,(MD_CHAR *)in_stack_ffffffffffffffb8,0);
    break;
  case (MD_CHAR *)0xa:
    render_verbatim(in_stack_ffffffffffffffc0,(MD_CHAR *)in_stack_ffffffffffffffb8,0);
    break;
  case (MD_CHAR *)0xb:
    render_verbatim(in_stack_ffffffffffffffc0,(MD_CHAR *)in_stack_ffffffffffffffb8,0);
    break;
  case (MD_CHAR *)0xc:
    render_verbatim(in_stack_ffffffffffffffc0,(MD_CHAR *)in_stack_ffffffffffffffb8,0);
    break;
  case (MD_CHAR *)0xd:
    render_verbatim(in_stack_ffffffffffffffc0,(MD_CHAR *)in_stack_ffffffffffffffb8,0);
    break;
  case (MD_CHAR *)0xe:
    render_open_td_block(in_RDX,cell_type,in_stack_ffffffffffffffd0);
    break;
  case (MD_CHAR *)0xf:
    render_open_td_block(in_RDX,cell_type,in_stack_ffffffffffffffd0);
  }
  return 0;
}

Assistant:

static int
enter_block_callback(MD_BLOCKTYPE type, void* detail, void* userdata)
{
    static const MD_CHAR* head[6] = { "<h1>", "<h2>", "<h3>", "<h4>", "<h5>", "<h6>" };
    MD_HTML* r = (MD_HTML*) userdata;

    switch(type) {
        case MD_BLOCK_DOC:      /* noop */ break;
        case MD_BLOCK_QUOTE:    RENDER_VERBATIM(r, "<blockquote>\n"); break;
        case MD_BLOCK_UL:       RENDER_VERBATIM(r, "<ul>\n"); break;
        case MD_BLOCK_OL:       render_open_ol_block(r, (const MD_BLOCK_OL_DETAIL*)detail); break;
        case MD_BLOCK_LI:       render_open_li_block(r, (const MD_BLOCK_LI_DETAIL*)detail); break;
        case MD_BLOCK_HR:       RENDER_VERBATIM(r, (r->flags & MD_HTML_FLAG_XHTML) ? "<hr />\n" : "<hr>\n"); break;
        case MD_BLOCK_H:        RENDER_VERBATIM(r, head[((MD_BLOCK_H_DETAIL*)detail)->level - 1]); break;
        case MD_BLOCK_CODE:     render_open_code_block(r, (const MD_BLOCK_CODE_DETAIL*) detail); break;
        case MD_BLOCK_HTML:     /* noop */ break;
        case MD_BLOCK_P:        RENDER_VERBATIM(r, "<p>"); break;
        case MD_BLOCK_TABLE:    RENDER_VERBATIM(r, "<table>\n"); break;
        case MD_BLOCK_THEAD:    RENDER_VERBATIM(r, "<thead>\n"); break;
        case MD_BLOCK_TBODY:    RENDER_VERBATIM(r, "<tbody>\n"); break;
        case MD_BLOCK_TR:       RENDER_VERBATIM(r, "<tr>\n"); break;
        case MD_BLOCK_TH:       render_open_td_block(r, "th", (MD_BLOCK_TD_DETAIL*)detail); break;
        case MD_BLOCK_TD:       render_open_td_block(r, "td", (MD_BLOCK_TD_DETAIL*)detail); break;
    }

    return 0;
}